

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateMembers
          (WrapperFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  WrapperFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "private static readonly pb::FieldCodec<$type_name$> _single_$name$_codec = ");
  (*(this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4])
            (this,printer);
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     ";\nprivate $type_name$ $name$_;\n");
  WritePropertyDocComment(printer,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "$access_level$ $type_name$ $property_name$ {\n  get { return $name$_; }\n  set {\n    $name$_ = value;\n  }\n}\n\n"
                    );
  bVar1 = SupportsPresenceApi((this->super_FieldGeneratorBase).descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                       "/// <summary>Gets whether the $descriptor_name$ field is set</summary>\n");
    FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
    io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                       "$access_level$ bool Has$property_name$ {\n  get { return $name$_ != null; }\n}\n\n"
                      );
    io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                       "/// <summary>Clears the value of the $descriptor_name$ field</summary>\n");
    FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
    io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                       "$access_level$ void Clear$property_name$() {\n  $name$_ = null;\n}\n");
  }
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateMembers(io::Printer* printer) {
  printer->Print(
        variables_,
        "private static readonly pb::FieldCodec<$type_name$> _single_$name$_codec = ");
  GenerateCodecCode(printer);
  printer->Print(
    variables_,
    ";\n"
    "private $type_name$ $name$_;\n");
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ $type_name$ $property_name$ {\n"
    "  get { return $name$_; }\n"
    "  set {\n"
    "    $name$_ = value;\n"
    "  }\n"
    "}\n\n");
  if (SupportsPresenceApi(descriptor_)) {
    printer->Print(
      variables_,
      "/// <summary>Gets whether the $descriptor_name$ field is set</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ bool Has$property_name$ {\n"
      "  get { return $name$_ != null; }\n"
      "}\n\n");
    printer->Print(
      variables_,
      "/// <summary>Clears the value of the $descriptor_name$ field</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ void Clear$property_name$() {\n"
      "  $name$_ = null;\n"
      "}\n");
  }
}